

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osportable.cc
# Opt level: O1

int os_gen_temp_filename(char *buf,size_t buflen)

{
  int __fd;
  char *pcVar1;
  char *pcVar2;
  
  pcVar1 = getenv("TMPDIR");
  pcVar2 = "/tmp";
  if (pcVar1 != (char *)0x0) {
    pcVar2 = pcVar1;
  }
  snprintf(buf,buflen,"%s/tads-XXXXXX",pcVar2);
  __fd = mkstemp(buf);
  if (-1 < __fd) {
    close(__fd);
  }
  return (uint)(-1 < __fd);
}

Assistant:

int
os_gen_temp_filename( char* buf, size_t buflen )
{
    // Get the temporary directory: use the environment variable TMPDIR
    // if it's defined, otherwise use P_tmpdir; if even that's not
    // defined, return failure.
    const char* tmp = getenv("TMPDIR");
    if (tmp == 0)
        tmp = P_tmpdir;
    if (tmp == 0)
        return false;

    // Build a template filename for mkstemp.
    snprintf(buf, buflen, "%s/tads-XXXXXX", tmp);

    // Generate a unique name and open the file.
    int fd = mkstemp(buf);
    if (fd >= 0) {
        // Got it - close the placeholder file and return success.
        close(fd);
        return true;
    }
    // Failed.
    return false;
}